

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeImportLogging(TranslateToFuzzReader *this)

{
  initializer_list<wasm::Expression_*> __l;
  Name target;
  mapped_type *pmVar1;
  Call *pCVar2;
  Type local_80 [3];
  allocator<wasm::Expression_*> local_61;
  uintptr_t local_60;
  Expression *local_58;
  iterator local_50;
  size_type local_48;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_40;
  size_t local_28;
  char *pcStack_20;
  Type local_18;
  Type type;
  TranslateToFuzzReader *this_local;
  
  type.id = (uintptr_t)this;
  local_18 = getLoggableType(this);
  pmVar1 = std::
           unordered_map<wasm::Type,_wasm::Name,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>_>
           ::operator[](&this->logImportNames,&local_18);
  local_28 = (pmVar1->super_IString).str._M_len;
  pcStack_20 = (pmVar1->super_IString).str._M_str;
  local_60 = local_18.id;
  local_58 = make(this,local_18);
  local_50 = &local_58;
  local_48 = 1;
  std::allocator<wasm::Expression_*>::allocator(&local_61);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_40,__l,&local_61);
  Type::Type(local_80,none);
  target.super_IString.str._M_str = pcStack_20;
  target.super_IString.str._M_len = local_28;
  pCVar2 = Builder::makeCall(&this->builder,target,&local_40,local_80[0],false);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_40);
  std::allocator<wasm::Expression_*>::~allocator(&local_61);
  return (Expression *)pCVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeImportLogging() {
  auto type = getLoggableType();
  return builder.makeCall(logImportNames[type], {make(type)}, Type::none);
}